

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O1

TValue * cploop_opt(lua_State *L,lua_CFunction dummy,void *ud)

{
  long lVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  undefined2 *puVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  ushort uVar10;
  ushort uVar11;
  uint uVar12;
  TRef TVar13;
  void *pvVar14;
  ulong uVar15;
  ushort *puVar16;
  ulong uVar17;
  ushort uVar18;
  ushort uVar19;
  uint uVar20;
  long lVar21;
  ushort *puVar22;
  undefined4 *puVar23;
  MSize nsz;
  ushort *puVar24;
  ulong uVar25;
  ushort *puVar26;
  undefined4 *puVar27;
  IRRef ref;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  uint uVar32;
  ulong uVar33;
  undefined4 uVar34;
  IRRef1 phi [64];
  uint local_fc;
  ushort auStack_b8 [68];
  
  uVar20 = *(uint *)((long)ud + 8);
  uVar15 = (ulong)((*(lua_State **)((long)ud + 0x60))->glref).ptr32;
  uVar12 = uVar20 * 2 - 0x10000;
  if (*(uint *)(uVar15 + 100) < uVar12) {
    nsz = 0x20;
    if (0x20 < uVar12) {
      nsz = uVar12;
    }
    pvVar14 = lj_mem_realloc(*(lua_State **)((long)ud + 0x60),*(void **)(uVar15 + 0x58),
                             *(uint *)(uVar15 + 100),nsz);
    *(void **)(uVar15 + 0x58) = pvVar14;
    *(MSize *)(uVar15 + 100) = nsz;
  }
  puVar6 = *(undefined2 **)(uVar15 + 0x58);
  *puVar6 = 0x8000;
  *(undefined2 *)((long)ud + 0x9c) = 0x1180;
  *(undefined4 *)((long)ud + 0x98) = 0;
  lj_ir_emit((jit_State *)ud);
  uVar5 = *(ushort *)((long)ud + 0x1c);
  uVar12 = (uint)uVar5 * 2 - 2;
  if (*(uint *)((long)ud + 0x114) < uVar12) {
    lj_snap_grow_buf_((jit_State *)ud,uVar12);
  }
  uVar15 = (ulong)(uVar5 - 1);
  uVar12 = (uint)*(byte *)(*(long *)((long)ud + 0x20) + 6 + uVar15 * 8) * (uVar5 - 2) +
           (uint)*(ushort *)((long)ud + 0x1e) * 2;
  if (*(uint *)((long)ud + 0x128) < uVar12) {
    lj_snap_grow_map_((jit_State *)ud,uVar12);
  }
  lVar21 = *(long *)((long)ud + 0x20);
  lVar31 = (ulong)*(ushort *)(lVar21 + uVar15 * 8) * 4 + *(long *)((long)ud + 0x28);
  uVar15 = (ulong)*(byte *)(lVar21 + 6 + uVar15 * 8);
  *(undefined4 *)(lVar31 + uVar15 * 4) = 0xff000000;
  local_fc = 0;
  if (0x8001 < uVar20) {
    local_fc = 0;
    uVar33 = 0x8001;
    puVar24 = (ushort *)(lVar21 + 8);
    do {
      puVar26 = puVar24;
      if (puVar24[1] <= uVar33) {
        puVar26 = puVar24 + 4;
        uVar19 = *puVar24;
        puVar22 = (ushort *)
                  ((ulong)((uint)*(ushort *)((long)ud + 0x1c) * 8) + *(long *)((long)ud + 0x20));
        puVar16 = puVar26;
        if (puVar26 == puVar22) {
          puVar16 = (ushort *)((long)ud + 0x1e);
        }
        uVar18 = *puVar16;
        bVar4 = (byte)puVar24[3];
        uVar10 = puVar24[2];
        if (*(char *)((long)ud + 0x96) < '\0') {
          uVar11 = *(ushort *)((long)ud + 0x1e);
          *(ushort *)((long)ud + 0x1c) = *(ushort *)((long)ud + 0x1c) + 1;
        }
        else {
          uVar11 = puVar22[-4];
          puVar22 = puVar22 + -4;
        }
        lVar7 = *(long *)((long)ud + 0x28);
        lVar21 = lVar7 + (ulong)uVar19 * 4;
        uVar17 = 0;
        *(undefined1 *)((long)ud + 0x96) = 0;
        *puVar22 = uVar11;
        puVar22[1] = *(ushort *)((long)ud + 8);
        *(byte *)(puVar22 + 2) = (byte)uVar10;
        *(undefined1 *)((long)puVar22 + 5) = *(undefined1 *)((long)puVar24 + 5);
        *(undefined1 *)((long)puVar22 + 7) = 0;
        lVar1 = lVar7 + (ulong)uVar11 * 4;
        uVar30 = 0;
        if (bVar4 != 0) {
          uVar30 = 0;
          uVar17 = 0;
          uVar25 = 0;
          do {
            uVar12 = *(uint *)(lVar21 + uVar25 * 4);
            uVar28 = *(uint *)(lVar31 + uVar17 * 4);
            uVar29 = uVar28 >> 0x18;
            uVar32 = uVar12 >> 0x18;
            if (uVar29 < uVar32) {
              *(uint *)(lVar1 + uVar30 * 4) = uVar28;
              uVar28 = (int)uVar17 + 1;
            }
            else {
              if (0x7fff < (uVar12 & 0xffff)) {
                uVar12 = (uint)(ushort)puVar6[(ulong)(uVar12 & 0xffff) - 0x8000] |
                         uVar12 & 0xfffb0000;
              }
              uVar28 = (int)uVar17 + (uint)(uVar29 == uVar32);
              *(uint *)(lVar1 + uVar30 * 4) = uVar12;
              uVar25 = (ulong)((int)uVar25 + 1);
            }
            uVar17 = (ulong)uVar28;
            uVar30 = (ulong)((int)uVar30 + 1);
          } while ((uint)uVar25 < (uint)bVar4);
        }
        uVar29 = (uint)uVar30;
        uVar28 = (uint)uVar17;
        uVar12 = *(uint *)(lVar31 + uVar17 * 4);
        while (uVar12 >> 0x18 < (uint)(byte)uVar10) {
          uVar28 = uVar28 + 1;
          uVar29 = (int)uVar30 + 1;
          *(uint *)(lVar1 + uVar30 * 4) = uVar12;
          uVar30 = (ulong)uVar29;
          uVar12 = *(uint *)(lVar31 + (ulong)uVar28 * 4);
        }
        *(char *)(puVar22 + 3) = (char)uVar29;
        puVar23 = (undefined4 *)(lVar1 + (ulong)uVar29 * 4);
        for (puVar27 = (undefined4 *)(lVar21 + (ulong)(uint)bVar4 * 4);
            puVar27 < (undefined4 *)(lVar7 + (ulong)uVar18 * 4); puVar27 = puVar27 + 1) {
          *puVar23 = *puVar27;
          puVar23 = puVar23 + 1;
        }
        *(ushort *)((long)ud + 0x1e) = (ushort)((uint)((int)puVar23 - (int)lVar7) >> 2);
      }
      lVar21 = *(long *)((long)ud + 0x10);
      uVar19 = *(ushort *)(lVar21 + uVar33 * 8);
      uVar18 = uVar19;
      if ((short)uVar19 < 0) {
        uVar18 = puVar6[(ulong)uVar19 - 0x8000];
      }
      uVar10 = *(ushort *)(lVar21 + 2 + uVar33 * 8);
      uVar11 = uVar10;
      if ((short)uVar10 < 0) {
        uVar11 = puVar6[(ulong)uVar10 - 0x8000];
      }
      if ((((lj_ir_mode[*(byte *)(lVar21 + 5 + uVar33 * 8)] & 0x60) == 0) && (uVar18 == uVar19)) &&
         (uVar11 == uVar10)) {
        puVar6[uVar33 - 0x8000] = (short)uVar33;
      }
      else {
        bVar4 = *(byte *)(lVar21 + 4 + uVar33 * 8);
        *(ushort *)((long)ud + 0x9c) = *(ushort *)(lVar21 + 4 + uVar33 * 8) & 0xffbf;
        *(ushort *)((long)ud + 0x98) = uVar18;
        *(ushort *)((long)ud + 0x9a) = uVar11;
        TVar13 = lj_opt_fold((jit_State *)ud);
        uVar12 = TVar13 & 0xffff;
        uVar30 = (ulong)uVar12;
        uVar19 = (ushort)TVar13;
        puVar6[uVar33 - 0x8000] = uVar19;
        if (uVar33 != uVar30) {
          lVar21 = *(long *)((long)ud + 0x10);
          if (uVar12 < uVar20) {
            if ((0x7fff < uVar12) &&
               (bVar3 = *(byte *)(lVar21 + 4 + uVar30 * 8),
               2 < (bVar3 & 0x1f) && (char)((bVar3 & 0x40) >> 6) == '\0')) {
              *(byte *)(lVar21 + 4 + uVar30 * 8) = bVar3 | 0x40;
              if (0x3f < local_fc) {
LAB_0013dc82:
                lj_trace_err((jit_State *)ud,LJ_TRERR_PHIOV);
              }
              uVar17 = (ulong)local_fc;
              local_fc = local_fc + 1;
              auStack_b8[uVar17] = uVar19;
            }
            bVar3 = *(byte *)(lVar21 + 4 + uVar30 * 8);
            if (((bVar3 ^ bVar4) & 0x1f) != 0) {
              uVar28 = bVar4 & 0x1f;
              uVar12 = uVar28 - 0x14;
              if ((uVar12 < 0xfffffffb) || (4 < (bVar3 & 0x1f) - 0xf)) {
                if (((uVar28 != 0xe) || (uVar34 = 0x550e01d3, 4 < (bVar3 & 0x1f) - 0xf)) &&
                   ((uVar12 < 0xfffffffb || (uVar34 = 0x5593326e, (bVar3 & 0x1f) != 0xe)))) {
                  lj_trace_err((jit_State *)ud,LJ_TRERR_TYPEINS);
                }
                *(ushort *)((long)ud + 0x98) = uVar19;
                *(undefined4 *)((long)ud + 0x9a) = uVar34;
                TVar13 = lj_opt_fold((jit_State *)ud);
                uVar12 = TVar13 & 0xffff;
                puVar6[uVar33 - 0x8000] = (short)TVar13;
                lVar21 = (ulong)(uVar12 * 8) + *(long *)((long)ud + 0x10);
                goto LAB_0013d8db;
              }
            }
          }
          else if (((uVar12 != 0xffff) && (uVar20 < uVar12)) &&
                  ((*(char *)(lVar21 + 5 + uVar30 * 8) == 'U' &&
                   (uVar12 = (uint)*(ushort *)(lVar21 + uVar30 * 8), uVar12 < uVar20)))) {
            lVar21 = lVar21 + (ulong)uVar12 * 8;
LAB_0013d8db:
            if ((0x7fff < uVar12 && uVar12 < uVar20) && ((*(byte *)(lVar21 + 4) & 0x40) == 0)) {
              *(byte *)(lVar21 + 4) = *(byte *)(lVar21 + 4) | 0x40;
              if (0x3f < local_fc) goto LAB_0013dc82;
              uVar30 = (ulong)local_fc;
              local_fc = local_fc + 1;
              auStack_b8[uVar30] = (ushort)uVar12;
            }
          }
        }
      }
      uVar33 = uVar33 + 1;
      puVar24 = puVar26;
    } while (uVar33 != uVar20);
  }
  if (-1 < *(char *)((long)ud + 0x96)) {
    uVar20 = *(int *)((long)ud + 0x1c) - 1;
    *(short *)((long)ud + 0x1c) = (short)uVar20;
    *(undefined2 *)((long)ud + 0x1e) =
         *(undefined2 *)(*(long *)((long)ud + 0x20) + (ulong)(uVar20 & 0xffff) * 8);
  }
  *(undefined4 *)(lVar31 + uVar15 * 4) =
       *(undefined4 *)
        (*(long *)((long)ud + 0x28) + (ulong)*(byte *)(*(long *)((long)ud + 0x20) + 6) * 4);
  uVar19 = *(ushort *)((long)ud + 0x162);
  if (local_fc == 0) {
    bVar9 = true;
    uVar15 = 0;
  }
  else {
    uVar33 = 0;
    bVar9 = false;
    uVar15 = 0;
    do {
      uVar18 = auStack_b8[uVar33];
      uVar30 = (ulong)uVar18;
      uVar10 = puVar6[uVar30 - 0x8000];
      if ((uVar18 == uVar10) || (uVar10 == 0xffff)) {
        pbVar2 = (byte *)(*(long *)((long)ud + 0x10) + 4 + uVar30 * 8);
        *pbVar2 = *pbVar2 & 0xbf;
      }
      else {
        uVar17 = (ulong)((int)uVar15 + 1);
        auStack_b8[uVar15] = uVar18;
        lVar21 = *(long *)((long)ud + 0x10);
        uVar15 = uVar17;
        if ((*(ushort *)(lVar21 + (ulong)uVar10 * 8) != uVar18) &&
           (*(ushort *)(lVar21 + 2 + (ulong)uVar10 * 8) != uVar18)) {
          pbVar2 = (byte *)(lVar21 + 4 + uVar30 * 8);
          *pbVar2 = *pbVar2 | 0x20;
          bVar9 = true;
        }
      }
      uVar33 = uVar33 + 1;
    } while (local_fc != uVar33);
    bVar9 = !bVar9;
  }
  if (!bVar9) {
    uVar20 = *(int *)((long)ud + 8) - 1;
    if (uVar19 < uVar20) {
      uVar33 = (ulong)uVar20;
      do {
        lVar21 = *(long *)((long)ud + 0x10);
        uVar18 = *(ushort *)(lVar21 + 2 + uVar33 * 8);
        if ((short)uVar18 < 0) {
          pbVar2 = (byte *)(lVar21 + 4 + (ulong)uVar18 * 8);
          *pbVar2 = *pbVar2 & 0xdf;
        }
        uVar18 = *(ushort *)(lVar21 + uVar33 * 8);
        if ((short)uVar18 < 0) {
          pbVar2 = (byte *)(*(long *)((long)ud + 0x10) + 4 + (ulong)uVar18 * 8);
          *pbVar2 = *pbVar2 & 0xdf;
          uVar18 = *(ushort *)(lVar21 + uVar33 * 8);
          if (((uVar18 < uVar19) && ((byte)(*(char *)(lVar21 + 5 + uVar33 * 8) + 0xa7U) < 5)) &&
             (*(char *)(*(long *)((long)ud + 0x10) + 5 + (ulong)uVar18 * 8) == ']')) {
            puVar24 = (ushort *)(*(long *)((long)ud + 0x10) + (ulong)uVar18 * 8);
            do {
              if ((short)puVar24[1] < 0) {
                pbVar2 = (byte *)(*(long *)((long)ud + 0x10) + 4 + (ulong)puVar24[1] * 8);
                *pbVar2 = *pbVar2 & 0xdf;
              }
              if (-1 < (short)*puVar24) break;
              puVar24 = (ushort *)(*(long *)((long)ud + 0x10) + (ulong)*puVar24 * 8);
              *(byte *)(puVar24 + 2) = (byte)puVar24[2] & 0xdf;
            } while (*(char *)((long)puVar24 + 5) == ']');
          }
        }
        uVar33 = uVar33 - 1;
      } while ((uint)uVar19 < (uint)uVar33);
    }
    uVar20 = (uint)*(ushort *)((long)ud + 0x1c);
    while (uVar20 = uVar20 - 1, uVar5 <= uVar20) {
      uVar33 = (ulong)*(byte *)(*(long *)((long)ud + 0x20) + 6 + (ulong)uVar20 * 8);
      if (uVar33 != 0) {
        uVar18 = *(ushort *)(*(long *)((long)ud + 0x20) + (ulong)uVar20 * 8);
        lVar21 = *(long *)((long)ud + 0x28);
        uVar30 = 0;
        do {
          uVar10 = *(ushort *)((ulong)uVar18 * 4 + lVar21 + uVar30 * 4);
          if (0x7fff < uVar10) {
            pbVar2 = (byte *)(*(long *)((long)ud + 0x10) + 4 + (ulong)uVar10 * 8);
            *pbVar2 = *pbVar2 & 0xdf;
          }
          uVar30 = uVar30 + 1;
        } while (uVar33 != uVar30);
      }
    }
  }
  uVar20 = *(int *)((long)ud + 0x8c) + *(int *)((long)ud + 0x90);
  if (1 < uVar20) {
    uVar33 = 1;
    do {
      uVar12 = (uint)*(ushort *)((long)ud + uVar33 * 4 + 0x1fc);
      uVar30 = uVar15;
      do {
        uVar15 = uVar30;
        if ((uVar12 < 0x8000) || (uVar17 = (ulong)uVar12, uVar12 == (ushort)puVar6[uVar17 - 0x8000])
           ) break;
        lVar21 = *(long *)((long)ud + 0x10);
        bVar4 = *(byte *)(lVar21 + 4 + uVar17 * 8);
        *(byte *)(lVar21 + 4 + uVar17 * 8) = bVar4 & 0xdf;
        if ((bVar4 & 0x1f) < 3 || (char)((bVar4 & 0x40) >> 6) != '\0') {
          bVar8 = false;
        }
        else {
          *(byte *)(lVar21 + 4 + uVar17 * 8) = bVar4 & 0xdf | 0x40;
          if (0x3f < (uint)uVar30) goto LAB_0013dc82;
          uVar15 = (ulong)((uint)uVar30 + 1);
          auStack_b8[uVar30] = (ushort)uVar12;
          uVar12 = (uint)(ushort)puVar6[uVar17 - 0x8000];
          bVar8 = (ushort)puVar6[uVar17 - 0x8000] <= uVar19;
        }
        uVar30 = uVar15;
      } while (bVar8);
      uVar33 = uVar33 + 1;
    } while (uVar33 != uVar20);
  }
  if (!bVar9) {
    if ((int)uVar15 == 0) {
      return (TValue *)0x0;
    }
    uVar33 = 0;
    bVar9 = false;
    do {
      do {
        bVar8 = bVar9;
        lVar21 = *(long *)((long)ud + 0x10);
        if ((*(byte *)(lVar21 + 4 + (ulong)auStack_b8[uVar33] * 8) & 0x20) == 0) {
          bVar4 = *(byte *)(lVar21 + 4 +
                           (ulong)(ushort)puVar6[(ulong)auStack_b8[uVar33] - 0x8000] * 8);
          if ((bVar4 & 0x20) != 0) {
            *(byte *)(lVar21 + 4 + (ulong)(ushort)puVar6[(ulong)auStack_b8[uVar33] - 0x8000] * 8) =
                 bVar4 & 0xdf;
            bVar8 = true;
          }
        }
        uVar33 = uVar33 + 1;
        bVar9 = bVar8;
      } while (uVar33 != uVar15);
      uVar33 = 0;
      bVar9 = false;
    } while (bVar8);
  }
  if ((int)uVar15 != 0) {
    uVar33 = 0;
    do {
      uVar5 = auStack_b8[uVar33];
      uVar30 = (ulong)uVar5;
      lVar21 = *(long *)((long)ud + 0x10);
      bVar4 = *(byte *)(lVar21 + 4 + uVar30 * 8);
      if ((bVar4 & 0x20) == 0) {
        uVar18 = puVar6[uVar30 - 0x8000];
        if (uVar19 < uVar18) {
          pbVar2 = (byte *)(lVar21 + 4 + (ulong)uVar18 * 8);
          *pbVar2 = *pbVar2 | 0x40;
        }
        *(ushort *)((long)ud + 0x9c) = *(byte *)(lVar21 + 4 + uVar30 * 8) & 0x1f | 0x1300;
        *(ushort *)((long)ud + 0x98) = uVar5;
        *(ushort *)((long)ud + 0x9a) = uVar18;
        lj_ir_emit((jit_State *)ud);
      }
      else {
        *(byte *)(lVar21 + 4 + uVar30 * 8) = bVar4 & 0x9f;
      }
      uVar33 = uVar33 + 1;
    } while (uVar15 != uVar33);
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cploop_opt(lua_State *L, lua_CFunction dummy, void *ud)
{
  UNUSED(L); UNUSED(dummy);
  loop_unroll((jit_State *)ud);
  return NULL;
}